

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O0

Result<wasm::Ok> * __thiscall
wasm::IRBuilder::makeStringWTF16Get(Result<wasm::Ok> *__return_storage_ptr__,IRBuilder *this)

{
  StringWTF16Get *pSVar1;
  bool bVar2;
  Ok local_9d;
  uint local_9c;
  Err local_98;
  Err *local_68;
  Err *err;
  Result<wasm::Ok> _val;
  StringWTF16Get curr;
  IRBuilder *this_local;
  
  pSVar1 = (StringWTF16Get *)
           ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20);
  StringWTF16Get::StringWTF16Get(pSVar1);
  UnifiedExpressionVisitor<wasm::IRBuilder,_wasm::Result<wasm::Ok>_>::visitStringWTF16Get
            ((Result<wasm::Ok> *)&err,
             (UnifiedExpressionVisitor<wasm::IRBuilder,_wasm::Result<wasm::Ok>_> *)this,pSVar1);
  local_68 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err);
  bVar2 = local_68 != (Err *)0x0;
  if (bVar2) {
    wasm::Err::Err(&local_98,local_68);
    Result<wasm::Ok>::Result(__return_storage_ptr__,&local_98);
    wasm::Err::~Err(&local_98);
  }
  local_9c = (uint)bVar2;
  Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err);
  if (local_9c == 0) {
    pSVar1 = Builder::makeStringWTF16Get
                       (&this->builder,
                        (Expression *)
                        curr.super_SpecificExpression<(wasm::Expression::Id)88>.super_Expression.
                        type.id,curr.ref);
    push(this,(Expression *)pSVar1);
    Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,&local_9d);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<> IRBuilder::makeStringWTF16Get() {
  StringWTF16Get curr;
  CHECK_ERR(visitStringWTF16Get(&curr));
  push(builder.makeStringWTF16Get(curr.ref, curr.pos));
  return Ok{};
}